

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O0

uint32_t ogt_vox_sample_anim_model(ogt_vox_anim_model *anim,uint32_t frame_index)

{
  int local_20;
  uint local_1c;
  int32_t f;
  uint32_t frame_index_local;
  ogt_vox_anim_model *anim_local;
  
  if (anim->num_keyframes == 0) {
    __assert_fail("(anim->num_keyframes >= 1) && (\"need at least one keyframe to sample\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0x518,"uint32_t ogt_vox_sample_anim_model(const ogt_vox_anim_model *, uint32_t)")
    ;
  }
  local_1c = frame_index;
  if ((anim->loop & 1U) != 0) {
    local_1c = compute_looped_frame_index
                         (anim->keyframes->frame_index,
                          anim->keyframes[anim->num_keyframes - 1].frame_index,frame_index);
  }
  if (anim->keyframes->frame_index < local_1c) {
    if (local_1c < anim->keyframes[anim->num_keyframes - 1].frame_index) {
      local_20 = anim->num_keyframes - 2;
      while( true ) {
        if (local_20 < 0) {
          __assert_fail("(0) && (\"shouldn\'t reach here\")",
                        "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                        ,0x525,
                        "uint32_t ogt_vox_sample_anim_model(const ogt_vox_anim_model *, uint32_t)");
        }
        if (anim->keyframes[local_20].frame_index <= local_1c) break;
        local_20 = local_20 + -1;
      }
      anim_local._4_4_ = anim->keyframes[local_20].model_index;
    }
    else {
      anim_local._4_4_ = anim->keyframes[anim->num_keyframes - 1].model_index;
    }
  }
  else {
    anim_local._4_4_ = anim->keyframes->model_index;
  }
  return anim_local._4_4_;
}

Assistant:

uint32_t ogt_vox_sample_anim_model(const ogt_vox_anim_model* anim, uint32_t frame_index)
    {
        ogt_assert(anim->num_keyframes >= 1, "need at least one keyframe to sample");
        if (anim->loop) {
            frame_index = compute_looped_frame_index(anim->keyframes[0].frame_index, anim->keyframes[anim->num_keyframes-1].frame_index, frame_index);
        }
        if (frame_index <= anim->keyframes[0].frame_index)
            return anim->keyframes[0].model_index;
        if (frame_index >=anim-> keyframes[anim->num_keyframes-1].frame_index)
            return anim->keyframes[anim->num_keyframes-1].model_index;
        for (int32_t f = (int32_t)anim->num_keyframes-2; f >= 0; f--) {
            if (frame_index >= anim->keyframes[f].frame_index) {
                return anim->keyframes[f+0].model_index;
            }
        }
        ogt_assert(0, "shouldn't reach here");
        return anim->keyframes[0].model_index;
    }